

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_node_input(Impl *this)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  undefined8 uVar1;
  Id IVar2;
  Id IVar3;
  Id type_id_00;
  Id IVar4;
  Id id;
  Builder *pBVar5;
  void *pvVar6;
  Builder *this_00;
  allocator_type local_113d;
  Id local_113c;
  iterator local_1138;
  undefined8 local_1130;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_1128;
  Id local_1110;
  Id local_110c;
  Id u64_struct_type_id;
  Id type_id;
  Id local_1100;
  Id local_10fc;
  Id local_10f8;
  Id local_10f4;
  Id local_10f0;
  Id local_10ec;
  Id local_10e8;
  Id local_10e4;
  iterator local_10e0;
  undefined8 local_10d8;
  undefined1 local_10d0 [8];
  Vector<spv::Id> members;
  allocator_type local_10ad;
  Id u32_array_ptr_type_id;
  iterator local_10a8;
  undefined8 local_10a0;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_1098;
  Id local_1080;
  Id local_107c;
  Id u32_array_struct_type_id;
  Id u32_ptr_type_id;
  iterator local_1070;
  undefined8 local_1068;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_1060;
  Id local_1044;
  Id local_1040;
  Id u32_struct_type_id;
  Id u32_array_type_id;
  Id ptr_shader_record_block_type_id;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Id global_invocation_id;
  Id workgroup_id;
  Id uvec3_type;
  Id u64_type_id;
  Id uvec2_type_id;
  Id u32_type_id;
  Impl *this_local;
  
  pBVar5 = builder(this);
  IVar2 = spv::Builder::makeUintType(pBVar5,0x20);
  pBVar5 = builder(this);
  IVar3 = spv::Builder::makeVectorType(pBVar5,IVar2,2);
  pBVar5 = builder(this);
  type_id_00 = spv::Builder::makeUintType(pBVar5,0x40);
  if ((this->node_input).payload_stride != 0) {
    IVar4 = create_variable(this,StorageClassPrivate,type_id_00,"NodeInputPayloadBDA");
    (this->node_input).private_bda_var_id = IVar4;
    IVar4 = create_variable(this,StorageClassPrivate,IVar2,"NodeInputStride");
    (this->node_input).private_stride_var_id = IVar4;
  }
  pBVar5 = builder(this);
  IVar4 = spv::Builder::makeVectorType(pBVar5,IVar2,3);
  id = create_variable(this,StorageClassPrivate,IVar4,"WorkgroupID");
  IVar4 = create_variable(this,StorageClassPrivate,IVar4,"GlobalInvocationID");
  SPIRVModule::register_builtin_shader_input(this->spirv_module,id,BuiltInWorkgroupId);
  SPIRVModule::register_builtin_shader_input(this->spirv_module,IVar4,BuiltInGlobalInvocationId);
  if (((this->options).inline_ubo_enable & 1U) == 0) {
    buffer._4088_8_ = get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,
              "[ERROR]: When compiling for nodes, inline UBO path must be enabled for root parameters.\n"
             );
      fflush(_stderr);
    }
    else {
      snprintf((char *)&u32_array_type_id,0x1000,
               "When compiling for nodes, inline UBO path must be enabled for root parameters.\n");
      uVar1 = buffer._4088_8_;
      pvVar6 = get_thread_log_callback_userdata();
      (*(code *)uVar1)(pvVar6,2,&u32_array_type_id);
    }
    this_local._7_1_ = false;
  }
  else {
    IVar4 = emit_shader_record_buffer_block_type(this,true);
    (this->node_input).shader_record_block_type_id = IVar4;
    u32_struct_type_id = 0;
    if ((this->node_input).shader_record_block_type_id == 0) {
      pBVar5 = builder(this);
      this_00 = builder(this);
      IVar4 = spv::Builder::makeUintType(this_00,0x20);
      u32_struct_type_id = spv::Builder::makeVectorType(pBVar5,IVar4,2);
    }
    else {
      pBVar5 = builder(this);
      u32_struct_type_id =
           spv::Builder::makePointer
                     (pBVar5,StorageClassPhysicalStorageBuffer,
                      (this->node_input).shader_record_block_type_id);
    }
    pBVar5 = builder(this);
    local_1040 = spv::Builder::makeRuntimeArray(pBVar5,IVar2);
    pBVar5 = builder(this);
    spv::Builder::addDecoration(pBVar5,local_1040,DecorationArrayStride,4);
    pBVar5 = builder(this);
    local_1070 = &u32_ptr_type_id;
    local_1068 = 1;
    __l_02._M_len = 1;
    __l_02._M_array = local_1070;
    u32_ptr_type_id = IVar2;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_1060,__l_02,(allocator_type *)((long)&u32_array_struct_type_id + 3));
    IVar4 = spv::Builder::makeStructType(pBVar5,&local_1060,"NodeReadonlyU32Ptr");
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_1060);
    local_1044 = IVar4;
    pBVar5 = builder(this);
    spv::Builder::addDecoration(pBVar5,local_1044,DecorationBlock,-1);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_1044,0,DecorationOffset,0);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_1044,0,DecorationNonWritable,-1);
    pBVar5 = builder(this);
    spv::Builder::addMemberName(pBVar5,local_1044,0,"value");
    pBVar5 = builder(this);
    local_107c = spv::Builder::makePointer(pBVar5,StorageClassPhysicalStorageBuffer,local_1044);
    pBVar5 = builder(this);
    u32_array_ptr_type_id = local_1040;
    local_10a8 = &u32_array_ptr_type_id;
    local_10a0 = 1;
    __l_01._M_len = 1;
    __l_01._M_array = local_10a8;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_1098,__l_01,&local_10ad);
    IVar4 = spv::Builder::makeStructType(pBVar5,&local_1098,"NodeReadonlyU32ArrayPtr");
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_1098);
    local_1080 = IVar4;
    pBVar5 = builder(this);
    spv::Builder::addDecoration(pBVar5,local_1080,DecorationBlock,-1);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_1080,0,DecorationOffset,0);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_1080,0,DecorationNonWritable,-1);
    pBVar5 = builder(this);
    spv::Builder::addMemberName(pBVar5,local_1080,0,"offsets");
    pBVar5 = builder(this);
    members.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         spv::Builder::makePointer(pBVar5,StorageClassPhysicalStorageBuffer,local_1080);
    local_1100 = local_107c;
    local_10fc = local_107c;
    local_10ec = u32_struct_type_id;
    local_10e0 = &type_id;
    local_10d8 = 9;
    __l_00._M_len = 9;
    __l_00._M_array = local_10e0;
    type_id = type_id_00;
    local_10f8 = IVar3;
    local_10f4 = type_id_00;
    local_10f0 = type_id_00;
    local_10e8 = IVar2;
    local_10e4 = IVar2;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_10d0,
               __l_00,(allocator_type *)((long)&u64_struct_type_id + 3));
    pBVar5 = builder(this);
    local_110c = spv::Builder::makeStructType
                           (pBVar5,(Vector<Id> *)local_10d0,"NodeDispatchRegisters");
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_110c,0,DecorationOffset,0);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_110c,1,DecorationOffset,8);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_110c,2,DecorationOffset,0x10);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_110c,3,DecorationOffset,0x18);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_110c,4,DecorationOffset,0x20);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_110c,5,DecorationOffset,0x28);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_110c,6,DecorationOffset,0x30);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_110c,7,DecorationOffset,0x38);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_110c,8,DecorationOffset,0x3c);
    pBVar5 = builder(this);
    spv::Builder::addMemberName(pBVar5,local_110c,0,"PayloadLinearBDA");
    pBVar5 = builder(this);
    spv::Builder::addMemberName(pBVar5,local_110c,1,"NodeLinearOffsetBDA");
    pBVar5 = builder(this);
    spv::Builder::addMemberName(pBVar5,local_110c,2,"NodeEndNodesBDA");
    pBVar5 = builder(this);
    spv::Builder::addMemberName(pBVar5,local_110c,3,"NodePayloadStrideOrOffsetsBDA");
    pBVar5 = builder(this);
    spv::Builder::addMemberName(pBVar5,local_110c,4,"NodePayloadOutputBDA");
    pBVar5 = builder(this);
    spv::Builder::addMemberName(pBVar5,local_110c,5,"NodePayloadOutputAtomicBDA");
    pBVar5 = builder(this);
    spv::Builder::addMemberName(pBVar5,local_110c,6,"NodeLocalRootSignatureBDA");
    pBVar5 = builder(this);
    spv::Builder::addMemberName(pBVar5,local_110c,7,"NodePayloadOutputOffset");
    pBVar5 = builder(this);
    spv::Builder::addMemberName(pBVar5,local_110c,8,"NodeRemainingRecursionLevels");
    pBVar5 = builder(this);
    spv::Builder::addDecoration(pBVar5,local_110c,DecorationBlock,-1);
    IVar3 = create_variable(this,StorageClassPushConstant,local_110c,"NodeDispatch");
    (this->node_input).node_dispatch_push_id = IVar3;
    pBVar5 = builder(this);
    spv::Builder::addDecoration
              (pBVar5,(this->node_input).node_dispatch_push_id,DecorationRestrictPointer,-1);
    IVar3 = create_variable(this,StorageClassPrivate,IVar2,"NodeCoalesceOffset");
    (this->node_input).private_coalesce_offset_id = IVar3;
    IVar2 = create_variable(this,StorageClassPrivate,IVar2,"NodeCoalesceCount");
    (this->node_input).private_coalesce_count_id = IVar2;
    (this->node_input).u32_ptr_type_id = local_107c;
    (this->node_input).u32_array_ptr_type_id =
         members.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pBVar5 = builder(this);
    local_1138 = &local_113c;
    local_1130 = 1;
    __l._M_len = 1;
    __l._M_array = local_1138;
    local_113c = type_id_00;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_1128,__l,&local_113d);
    IVar2 = spv::Builder::makeStructType(pBVar5,&local_1128,"NodeReadonlyU64Ptr");
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_1128);
    local_1110 = IVar2;
    pBVar5 = builder(this);
    spv::Builder::addDecoration(pBVar5,local_1110,DecorationBlock,-1);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_1110,0,DecorationOffset,0);
    pBVar5 = builder(this);
    spv::Builder::addMemberDecoration(pBVar5,local_1110,0,DecorationNonWritable,-1);
    pBVar5 = builder(this);
    spv::Builder::addMemberName(pBVar5,local_1110,0,"value");
    pBVar5 = builder(this);
    IVar2 = spv::Builder::makePointer(pBVar5,StorageClassPhysicalStorageBuffer,local_1110);
    (this->node_input).u64_ptr_type_id = IVar2;
    this_local._7_1_ = true;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_10d0);
  }
  return this_local._7_1_;
}

Assistant:

bool Converter::Impl::emit_execution_modes_node_input()
{
	spv::Id u32_type_id = builder().makeUintType(32);
	spv::Id uvec2_type_id = builder().makeVectorType(u32_type_id, 2);
	spv::Id u64_type_id = builder().makeUintType(64);

	if (node_input.payload_stride)
	{
		node_input.private_bda_var_id = create_variable(
			spv::StorageClassPrivate, u64_type_id, "NodeInputPayloadBDA");
		node_input.private_stride_var_id = create_variable(
			spv::StorageClassPrivate, u32_type_id, "NodeInputStride");
	}

	// We have to rewrite global IDs. Local invocation should remain intact.
	spv::Id uvec3_type = builder().makeVectorType(u32_type_id, 3);
	spv::Id workgroup_id = create_variable(spv::StorageClassPrivate, uvec3_type, "WorkgroupID");
	spv::Id global_invocation_id = create_variable(spv::StorageClassPrivate, uvec3_type, "GlobalInvocationID");
	spirv_module.register_builtin_shader_input(workgroup_id, spv::BuiltInWorkgroupId);
	spirv_module.register_builtin_shader_input(global_invocation_id, spv::BuiltInGlobalInvocationId);

	// Emit binding model.
	// Push constants are our only option.
	if (!options.inline_ubo_enable)
	{
		LOGE("When compiling for nodes, inline UBO path must be enabled for root parameters.\n");
		return false;
	}

	node_input.shader_record_block_type_id = emit_shader_record_buffer_block_type(true);
	spv::Id ptr_shader_record_block_type_id = 0;
	if (node_input.shader_record_block_type_id)
	{
		ptr_shader_record_block_type_id =
			builder().makePointer(spv::StorageClassPhysicalStorageBuffer,
			                      node_input.shader_record_block_type_id);
	}
	else
	{
		// Dummy type
		ptr_shader_record_block_type_id = builder().makeVectorType(builder().makeUintType(32), 2);
	}

	// Declare the ABI for dispatching a node. This will change depending on the dispatch mode,
	// and style of execution (indirect pull or array).

	spv::Id u32_array_type_id = builder().makeRuntimeArray(u32_type_id);
	builder().addDecoration(u32_array_type_id, spv::DecorationArrayStride, 4);

	spv::Id u32_struct_type_id = builder().makeStructType({ u32_type_id }, "NodeReadonlyU32Ptr");
	builder().addDecoration(u32_struct_type_id, spv::DecorationBlock);
	builder().addMemberDecoration(u32_struct_type_id, 0, spv::DecorationOffset, 0);
	builder().addMemberDecoration(u32_struct_type_id, 0, spv::DecorationNonWritable);
	builder().addMemberName(u32_struct_type_id, 0, "value");
	spv::Id u32_ptr_type_id = builder().makePointer(spv::StorageClassPhysicalStorageBuffer, u32_struct_type_id);

	spv::Id u32_array_struct_type_id = builder().makeStructType({ u32_array_type_id }, "NodeReadonlyU32ArrayPtr");
	builder().addDecoration(u32_array_struct_type_id, spv::DecorationBlock);
	builder().addMemberDecoration(u32_array_struct_type_id, 0, spv::DecorationOffset, 0);
	builder().addMemberDecoration(u32_array_struct_type_id, 0, spv::DecorationNonWritable);
	builder().addMemberName(u32_array_struct_type_id, 0, "offsets");
	spv::Id u32_array_ptr_type_id = builder().makePointer(spv::StorageClassPhysicalStorageBuffer, u32_array_struct_type_id);

	const Vector<spv::Id> members = {
		u64_type_id,
		u32_ptr_type_id,
		u32_ptr_type_id,
		uvec2_type_id,
		u64_type_id,
		u64_type_id,
		ptr_shader_record_block_type_id,
		u32_type_id,
		u32_type_id,
	};

	spv::Id type_id = builder().makeStructType(members, "NodeDispatchRegisters");
	builder().addMemberDecoration(type_id, NodePayloadBDA, spv::DecorationOffset, 0);
	builder().addMemberDecoration(type_id, NodeLinearOffsetBDA, spv::DecorationOffset, 8);
	builder().addMemberDecoration(type_id, NodeEndNodesBDA, spv::DecorationOffset, 16);
	builder().addMemberDecoration(type_id, NodePayloadStrideOrOffsetsBDA, spv::DecorationOffset, 24);
	builder().addMemberDecoration(type_id, NodePayloadOutputBDA, spv::DecorationOffset, 32);
	builder().addMemberDecoration(type_id, NodePayloadOutputAtomicBDA, spv::DecorationOffset, 40);
	builder().addMemberDecoration(type_id, NodeLocalRootSignatureBDA, spv::DecorationOffset, 48);
	builder().addMemberDecoration(type_id, NodePayloadOutputOffset, spv::DecorationOffset, 56);
	builder().addMemberDecoration(type_id, NodeRemainingRecursionLevels, spv::DecorationOffset, 60);

	// For linear node layout (entry point).
	// Node payload is found at PayloadLinearBDA + NodeIndex * PayloadStride.
	builder().addMemberName(type_id, NodePayloadBDA, "PayloadLinearBDA");
	// With packed workgroup layout, need to apply an offset.
	builder().addMemberName(type_id, NodeLinearOffsetBDA, "NodeLinearOffsetBDA");
	// For thread and coalesce, need to know total number of threads to mask execution on edge.
	builder().addMemberName(type_id, NodeEndNodesBDA, "NodeEndNodesBDA");
	builder().addMemberName(type_id, NodePayloadStrideOrOffsetsBDA, "NodePayloadStrideOrOffsetsBDA");
	builder().addMemberName(type_id, NodePayloadOutputBDA, "NodePayloadOutputBDA");
	builder().addMemberName(type_id, NodePayloadOutputAtomicBDA, "NodePayloadOutputAtomicBDA");
	builder().addMemberName(type_id, NodeLocalRootSignatureBDA, "NodeLocalRootSignatureBDA");
	// For broadcast nodes. Need to instance multiple times.
	// Becomes WorkGroupID and affects GlobalInvocationID.
	builder().addMemberName(type_id, NodePayloadOutputOffset, "NodePayloadOutputOffset");
	builder().addMemberName(type_id, NodeRemainingRecursionLevels, "NodeRemainingRecursionLevels");
	builder().addDecoration(type_id, spv::DecorationBlock);
	node_input.node_dispatch_push_id =
	    create_variable(spv::StorageClassPushConstant, type_id, "NodeDispatch");
	builder().addDecoration(node_input.node_dispatch_push_id, spv::DecorationRestrictPointer);

	node_input.private_coalesce_offset_id =
		create_variable(spv::StorageClassPrivate, u32_type_id, "NodeCoalesceOffset");
	node_input.private_coalesce_count_id =
		create_variable(spv::StorageClassPrivate, u32_type_id, "NodeCoalesceCount");

	node_input.u32_ptr_type_id = u32_ptr_type_id;
	node_input.u32_array_ptr_type_id = u32_array_ptr_type_id;

	spv::Id u64_struct_type_id = builder().makeStructType({ u64_type_id }, "NodeReadonlyU64Ptr");
	builder().addDecoration(u64_struct_type_id, spv::DecorationBlock);
	builder().addMemberDecoration(u64_struct_type_id, 0, spv::DecorationOffset, 0);
	builder().addMemberDecoration(u64_struct_type_id, 0, spv::DecorationNonWritable);
	builder().addMemberName(u64_struct_type_id, 0, "value");
	node_input.u64_ptr_type_id = builder().makePointer(spv::StorageClassPhysicalStorageBuffer, u64_struct_type_id);

	return true;
}